

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O1

void OpenSteer::drawBasic3dSphericalVehicle(AbstractVehicle *vehicle,Color *color)

{
  PFNGLCOLOR3FPROC p_Var1;
  int in_ECX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *pvVar2;
  Color *rhs;
  char *in_R8;
  int in_R9D;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float fVar3;
  float extraout_XMM0_Da_03;
  float fVar4;
  float extraout_XMM0_Da_04;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  GLfloat extraout_XMM0_Da_05;
  float fVar11;
  float fVar12;
  GLfloat extraout_XMM0_Da_06;
  GLfloat extraout_XMM0_Da_07;
  GLfloat extraout_XMM0_Da_08;
  GLfloat extraout_XMM0_Da_09;
  GLfloat extraout_XMM0_Da_10;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float in_XMM1_Da;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Color color5;
  Color color4;
  Color color3;
  Color color2;
  Color color1;
  int in_stack_fffffffffffffe98;
  Color local_90;
  Color local_80;
  Color local_70;
  Color local_60;
  Color local_50;
  Color local_40;
  
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0x18])();
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(vehicle);
  fVar5 = in_XMM1_Da;
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[6])(vehicle);
  fVar6 = fVar5 * extraout_XMM0_Da;
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[2])(vehicle);
  fVar15 = extraout_XMM0_Da * extraout_XMM0_Da_02 * 0.5;
  fVar3 = extraout_XMM0_Db_01 * extraout_XMM0_Da * 0.5;
  fVar13 = fVar6 * extraout_XMM0_Da * 0.5;
  fVar6 = fVar13;
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[4])(vehicle);
  fVar16 = extraout_XMM0_Da * extraout_XMM0_Da_03 * 0.5 * 0.5;
  fVar4 = extraout_XMM0_Db_02 * extraout_XMM0_Da * 0.5 * 0.5;
  fVar14 = fVar6 * extraout_XMM0_Da * 0.5 * 0.5;
  fVar6 = fVar14;
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[6])(vehicle);
  fVar17 = extraout_XMM0_Da * extraout_XMM0_Da_01 + extraout_XMM0_Da_00;
  fVar19 = extraout_XMM0_Db_00 * extraout_XMM0_Da + extraout_XMM0_Db;
  fVar21 = fVar5 * extraout_XMM0_Da + in_XMM1_Da;
  fVar20 = extraout_XMM0_Da_00 - extraout_XMM0_Da * extraout_XMM0_Da_04 * 0.8660254;
  fVar18 = extraout_XMM0_Db - extraout_XMM0_Db_03 * extraout_XMM0_Da * 0.8660254;
  in_XMM1_Da = in_XMM1_Da - fVar6 * extraout_XMM0_Da * 0.8660254;
  fVar5 = fVar20 - fVar15;
  fVar6 = fVar18 - fVar3;
  fVar7 = in_XMM1_Da - fVar13;
  fVar8 = fVar16 + fVar20;
  fVar9 = fVar4 + fVar18;
  fVar10 = fVar14 + in_XMM1_Da;
  Color::Color(&local_60,0.05,0.05,-0.05,1.0);
  local_50 = operator+(color,&local_60);
  Color::Color(&local_70,0.05,-0.05,0.05,1.0);
  local_60 = operator+(color,&local_70);
  Color::Color(&local_80,-0.05,0.05,0.05,1.0);
  local_70 = operator+(color,&local_80);
  Color::Color(&local_90,-0.05,0.05,-0.05,1.0);
  local_80 = operator+(color,&local_90);
  rhs = &local_40;
  Color::Color(rhs,-0.05,-0.05,0.05,1.0);
  local_90 = operator+(color,rhs);
  pvVar2 = extraout_RDX;
  if (updatePhaseActive == '\x01') {
    warnIfInUpdatePhase2("iDrawTriangle");
    pvVar2 = extraout_RDX_00;
  }
  p_Var1 = glad_glColor3f;
  fVar15 = fVar15 + fVar20;
  fVar3 = fVar3 + fVar18;
  fVar13 = fVar13 + in_XMM1_Da;
  Color::r(&local_50,rhs,pvVar2,in_ECX,in_R8,in_R9D,in_stack_fffffffffffffe98);
  fVar11 = Color::g(&local_50);
  fVar12 = Color::b(&local_50);
  (*p_Var1)(extraout_XMM0_Da_05,fVar11,fVar12);
  (*glad_glBegin)(4);
  (*glad_glVertex3f)(fVar17,fVar19,fVar21);
  (*glad_glVertex3f)(fVar5,fVar6,fVar7);
  (*glad_glVertex3f)(fVar8,fVar9,fVar10);
  (*glad_glEnd)();
  pvVar2 = extraout_RDX_01;
  if (updatePhaseActive == '\x01') {
    warnIfInUpdatePhase2("iDrawTriangle");
    pvVar2 = extraout_RDX_02;
  }
  p_Var1 = glad_glColor3f;
  fVar20 = fVar20 - fVar16;
  fVar18 = fVar18 - fVar4;
  in_XMM1_Da = in_XMM1_Da - fVar14;
  Color::r(&local_60,rhs,pvVar2,in_ECX,in_R8,in_R9D,in_stack_fffffffffffffe98);
  fVar4 = Color::g(&local_60);
  fVar14 = Color::b(&local_60);
  (*p_Var1)(extraout_XMM0_Da_06,fVar4,fVar14);
  (*glad_glBegin)(4);
  (*glad_glVertex3f)(fVar17,fVar19,fVar21);
  (*glad_glVertex3f)(fVar8,fVar9,fVar10);
  (*glad_glVertex3f)(fVar15,fVar3,fVar13);
  (*glad_glEnd)();
  pvVar2 = extraout_RDX_03;
  if (updatePhaseActive == '\x01') {
    warnIfInUpdatePhase2("iDrawTriangle");
    pvVar2 = extraout_RDX_04;
  }
  p_Var1 = glad_glColor3f;
  Color::r(&local_70,rhs,pvVar2,in_ECX,in_R8,in_R9D,in_stack_fffffffffffffe98);
  fVar4 = Color::g(&local_70);
  fVar14 = Color::b(&local_70);
  (*p_Var1)(extraout_XMM0_Da_07,fVar4,fVar14);
  (*glad_glBegin)(4);
  (*glad_glVertex3f)(fVar17,fVar19,fVar21);
  (*glad_glVertex3f)(fVar20,fVar18,in_XMM1_Da);
  (*glad_glVertex3f)(fVar5,fVar6,fVar7);
  (*glad_glEnd)();
  pvVar2 = extraout_RDX_05;
  if (updatePhaseActive == '\x01') {
    warnIfInUpdatePhase2("iDrawTriangle");
    pvVar2 = extraout_RDX_06;
  }
  p_Var1 = glad_glColor3f;
  Color::r(&local_80,rhs,pvVar2,in_ECX,in_R8,in_R9D,in_stack_fffffffffffffe98);
  fVar4 = Color::g(&local_80);
  fVar14 = Color::b(&local_80);
  (*p_Var1)(extraout_XMM0_Da_08,fVar4,fVar14);
  (*glad_glBegin)(4);
  (*glad_glVertex3f)(fVar17,fVar19,fVar21);
  (*glad_glVertex3f)(fVar15,fVar3,fVar13);
  (*glad_glVertex3f)(fVar20,fVar18,in_XMM1_Da);
  (*glad_glEnd)();
  pvVar2 = extraout_RDX_07;
  if (updatePhaseActive == '\x01') {
    warnIfInUpdatePhase2("iDrawTriangle");
    pvVar2 = extraout_RDX_08;
  }
  p_Var1 = glad_glColor3f;
  Color::r(&local_90,rhs,pvVar2,in_ECX,in_R8,in_R9D,in_stack_fffffffffffffe98);
  fVar4 = Color::g(&local_90);
  fVar14 = Color::b(&local_90);
  (*p_Var1)(extraout_XMM0_Da_09,fVar4,fVar14);
  (*glad_glBegin)(4);
  (*glad_glVertex3f)(fVar5,fVar6,fVar7);
  (*glad_glVertex3f)(fVar15,fVar3,fVar13);
  (*glad_glVertex3f)(fVar8,fVar9,fVar10);
  (*glad_glEnd)();
  pvVar2 = extraout_RDX_09;
  if (updatePhaseActive == '\x01') {
    warnIfInUpdatePhase2("iDrawTriangle");
    pvVar2 = extraout_RDX_10;
  }
  p_Var1 = glad_glColor3f;
  Color::r(&local_90,rhs,pvVar2,in_ECX,in_R8,in_R9D,in_stack_fffffffffffffe98);
  fVar4 = Color::g(&local_90);
  fVar8 = Color::b(&local_90);
  (*p_Var1)(extraout_XMM0_Da_10,fVar4,fVar8);
  (*glad_glBegin)(4);
  (*glad_glVertex3f)(fVar15,fVar3,fVar13);
  (*glad_glVertex3f)(fVar5,fVar6,fVar7);
  (*glad_glVertex3f)(fVar20,fVar18,in_XMM1_Da);
  (*glad_glEnd)();
  return;
}

Assistant:

void 
OpenSteer::drawBasic3dSphericalVehicle (const AbstractVehicle* vehicle,
                                        const Color& color)
{
    // "aspect ratio" of body (as seen from above)
    const float x = 0.5f;
    const float y = sqrtXXX (1 - (x * x));

    // radius and position of vehicle
    const float r = vehicle->radius();
    const Vec3& p = vehicle->position();

    // body shape parameters
    const Vec3 f = r * vehicle->forward();
    const Vec3 s = r * vehicle->side() * x;
    const Vec3 u = r * vehicle->up() * x * 0.5f;
    const Vec3 b = r * vehicle->forward() * -y;

    // vertex positions
    const Vec3 nose   = p + f;
    const Vec3 side1  = p + b - s;
    const Vec3 side2  = p + b + s;
    const Vec3 top    = p + b + u;
    const Vec3 bottom = p + b - u;

    // colors
    const float j = +0.05f;
    const float k = -0.05f;
    const Color color1 = color + Color(j, j, k);
    const Color color2 = color + Color(j, k, j);
    const Color color3 = color + Color(k, j, j);
    const Color color4 = color + Color(k, j, k);
    const Color color5 = color + Color(k, k, j);

    // draw body
    iDrawTriangle (nose,  side1,  top,    color1);  // top, side 1
    iDrawTriangle (nose,  top,    side2,  color2);  // top, side 2
    iDrawTriangle (nose,  bottom, side1,  color3);  // bottom, side 1
    iDrawTriangle (nose,  side2,  bottom, color4);  // bottom, side 2
    iDrawTriangle (side1, side2,  top,    color5);  // top back
    iDrawTriangle (side2, side1,  bottom, color5);  // bottom back
}